

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_cubic_interpolation.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  void *pvVar2;
  PointType *pPVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  PointType *pPVar8;
  PointType p;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> vec;
  double t;
  Mat img;
  CubicInterpolation cubic;
  undefined1 local_168 [44];
  undefined4 uStack_13c;
  PointType *local_138;
  double dStack_130;
  void *local_128;
  double dStack_120;
  long local_118;
  double local_110;
  int local_108;
  int local_104;
  _InputArray local_100;
  PointType local_e8 [6];
  CubicInterpolation local_88;
  
  local_88.super_Curve<3,_2>.length_ = -1.0;
  local_88.super_Curve<3,_2>._vptr_Curve = (_func_int **)&PTR_computeLength_00107a00;
  local_88.coeffs_[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  local_88.coeffs_[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  local_88.coeffs_[1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  local_88.coeffs_[1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  local_88.coeffs_[2].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  local_88.coeffs_[2].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  local_88.coeffs_[3].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  local_88.coeffs_[3].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  local_e8[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
       = 100.0;
  local_e8[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
       = 100.0;
  local_168._0_8_ = (_func_int **)0x4072c00000000000;
  local_168._8_8_ = 300.0;
  CubicInterpolation::interpolation(&local_88,local_e8,0.0,(PointType *)local_168,0.0);
  local_168._16_8_ = 0.0;
  local_168._24_8_ = 0.0;
  local_168._0_8_ = (_func_int **)0x0;
  local_168._8_8_ = 0.0;
  cv::Mat::Mat((Mat *)local_e8,400,400,0x10,(Scalar_ *)local_168);
  local_100.obj = &local_128;
  local_118 = 0;
  local_128 = (void *)0x0;
  dStack_120 = 0.0;
  local_110 = 0.0;
  do {
    local_168._40_4_ = 0;
    CubicInterpolation::at((CubicInterpolation *)local_168,(double *)&local_88,(int *)&local_110);
    local_168._40_4_ = (undefined4)(double)local_168._0_8_;
    local_100.flags = (int)(double)local_168._8_8_;
    std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<int,int>
              ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)local_100.obj,
               (int *)(local_168 + 0x28),&local_100.flags);
    local_110 = local_110 + 0.01;
  } while (local_110 <= 1.0);
  dStack_130 = 0.0;
  local_168._40_4_ = 0x3010000;
  local_138 = local_e8;
  local_100.sz.width = 0;
  local_100.sz.height = 0;
  local_100.flags = -0x7efcfff4;
  local_168._0_8_ = (_func_int **)0x0;
  local_168._8_8_ = 0.0;
  local_168._16_8_ = 255.0;
  local_168._24_8_ = 0.0;
  cv::polylines((_InputOutputArray *)(local_168 + 0x28),&local_100,false,(Scalar_ *)local_168,1,0x10
                ,0);
  local_168._32_8_ = 0.0;
  if (8 < (ulong)((long)dStack_120 - (long)local_128)) {
    uVar7 = 1;
    local_168._32_8_ = 0.0;
    do {
      iVar5 = *(int *)((long)local_128 + uVar7 * 8) - *(int *)((long)local_128 + uVar7 * 8 + -8);
      iVar6 = *(int *)((long)local_128 + uVar7 * 8 + 4) - *(int *)((long)local_128 + uVar7 * 8 + -4)
      ;
      dVar1 = (double)(iVar6 * iVar6 + iVar5 * iVar5);
      if (dVar1 < 0.0) {
        dVar1 = sqrt(dVar1);
      }
      else {
        dVar1 = SQRT(dVar1);
      }
      local_168._32_8_ = (double)local_168._32_8_ + dVar1;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)dStack_120 - (long)local_128 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"naive length: ",0xe);
  poVar4 = std::ostream::_M_insert<double>((double)local_168._32_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"length: ",8);
  poVar4 = std::ostream::_M_insert<double>(local_88.super_Curve<3,_2>.length_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_168._0_8_ = (_func_int **)0x4034000000000000;
  local_100.flags = 4;
  Curve<3,_2>::sampleWithArcLengthParameterized
            ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)(local_168 + 0x28),&local_88.super_Curve<3,_2>,(double *)local_168,true,
             &local_100.flags,(vector<double,_std::allocator<double>_> *)0x0);
  pPVar3 = local_138;
  pPVar8 = (PointType *)CONCAT44(uStack_13c,local_168._40_4_);
  if (pPVar8 != local_138) {
    do {
      local_108 = (int)(pPVar8->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                       m_storage.m_data.array[0];
      local_104 = (int)(pPVar8->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                       m_storage.m_data.array[1];
      local_100.sz.width = 0;
      local_100.sz.height = 0;
      local_100.flags = 0x3010000;
      local_100.obj = local_e8;
      local_168._0_8_ = (_func_int **)0x406fe00000000000;
      local_168._8_8_ = 255.0;
      local_168._16_8_ = 255.0;
      local_168._24_8_ = 0.0;
      cv::circle(&local_100,&local_108,4,local_168,1,8,0);
      pPVar8 = pPVar8 + 1;
    } while (pPVar8 != pPVar3);
  }
  pvVar2 = (void *)CONCAT44(uStack_13c,local_168._40_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)dStack_130 - (long)pvVar2);
  }
  local_168._0_8_ = local_168 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"Cubic Interpolation","");
  dStack_130 = 0.0;
  local_168._40_4_ = 0x1010000;
  local_138 = local_e8;
  cv::imshow((string *)local_168,(_InputArray *)(local_168 + 0x28));
  if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
  }
  cv::waitKey(0);
  if (local_128 != (void *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  cv::Mat::~Mat((Mat *)local_e8);
  return 0;
}

Assistant:

int main() {
  // fit a cubic spline
  CubicInterpolation cubic;
  cubic.interpolation({100, 100}, 0, {300, 300}, 0);

  int width = 400;
  Mat img(width, width, CV_8UC3, Scalar(0));

  vector<Point> vec;
  double t = 0.0, step = 0.01;
  while (t <= 1.0) {
    auto p = cubic.at(t);
    vec.emplace_back(int(p[0]), int(p[1]));
    t += step;
  }
  polylines(img, vec, false, {0, 0, 255}, 1, LINE_AA);
  double acc_length = 0;
  for (int i = 1; i < vec.size(); ++i) {
    auto p = (vec[i] - vec[i - 1]);
    acc_length += sqrt(p.x * p.x + p.y * p.y);
  }
  cout << "naive length: " << acc_length << endl;
  cout << "length: " << cubic.length() << endl;

  // Uniform sampling
  for (auto p : cubic.sampleWithArcLengthParameterized(20)) {
    cv::circle(img, {int(p.x()), int(p.y())}, 4, {255, 255, 255}, 1);
  }

  imshow("Cubic Interpolation", img);
  waitKey(0);

  return 0;
}